

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cpp
# Opt level: O2

void use_iterator_insert(void)

{
  pointer s;
  allocator local_131;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string s3 [2];
  string s2 [2];
  string s1 [4];
  
  std::__cxx11::string::string((string *)s1,"Monday",(allocator *)s2);
  std::__cxx11::string::string((string *)(s1 + 1),"Tuesday",(allocator *)s3);
  std::__cxx11::string::string((string *)(s1 + 2),"Wednesday",(allocator *)&words);
  std::__cxx11::string::string((string *)(s1 + 3),"Thursday",&local_131);
  std::__cxx11::string::string((string *)s2,"Even",(allocator *)s3);
  std::__cxx11::string::string((string *)(s2 + 1),"Odd",(allocator *)&words);
  std::__cxx11::string::string((string *)s3,"Male",(allocator *)&words);
  std::__cxx11::string::string((string *)(s3 + 1),"Female",&local_131);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&words,4,(allocator_type *)&local_131);
  std::
  __copy_move_a<false,std::__cxx11::string*,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (s1,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &stack0xffffffffffffffe8,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )words.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  for (s = words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      s != words.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; s = s + 1) {
    output(s);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
}

Assistant:

void use_iterator_insert() {
    using namespace std;

    string s1[4] = {
            "Monday",
            "Tuesday",
            "Wednesday",
            "Thursday",
    };

    string s2[2] = {
            "Even",
            "Odd",
    };

    string s3[2] = {
            "Male",
            "Female",
    };

    vector<string> words(4);

    //  copy is provided by 'algorithm'
    copy(s1, s1 + 4, words.begin());
    //  for_each is also provided by 'algorithm'
    //  arr.forEach in javascript
    for_each(words.begin(), words.end(), output);
    //  normal 'mon', 'tue', 'wed', 'thur'
    cout << endl;

    //  create a temp back_insert_iterator object from 'words'
    //  insert at the **back**
    copy(s2, s2 + 2, back_insert_iterator<vector<string>>(words));
    for_each(words.begin(), words.end(), output);
    //
    cout << endl;

    //  temp insert_iterator
    //  insert at the "beginning"
    copy(s3, s3 + 2, insert_iterator<vector<string>>(words, words.begin() + 0));
    for_each(words.begin(), words.end(), output);
    cout << endl;
}